

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utScenePreprocessor.cpp
# Opt level: O2

void __thiscall
ScenePreprocessorTest_testMeshPreprocessingNeg_Test::TestBody
          (ScenePreprocessorTest_testMeshPreprocessingNeg_Test *this)

{
  aiMesh *this_00;
  char *message;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  AssertHelper local_30;
  AssertionResult gtest_ar;
  
  this_00 = (aiMesh *)operator_new(0x520);
  aiMesh::aiMesh(this_00);
  this_00->mPrimitiveTypes = 0xc;
  ScenePreprocessorTest::ProcessMesh(&this->super_ScenePreprocessorTest,this_00);
  local_38.ptr_._0_4_ = 0xc;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,
             "static_cast<unsigned int>(aiPrimitiveType_TRIANGLE|aiPrimitiveType_POLYGON)",
             "p->mPrimitiveTypes",(uint *)&local_38,(uint *)this_00);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/test/unit/utScenePreprocessor.cpp"
               ,0x9b,message);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_38);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  aiMesh::~aiMesh(this_00);
  operator_delete(this_00,0x520);
  return;
}

Assistant:

TEST_F(ScenePreprocessorTest, testMeshPreprocessingNeg) {
    aiMesh* p = new aiMesh;
    p->mPrimitiveTypes = aiPrimitiveType_TRIANGLE|aiPrimitiveType_POLYGON;
    ProcessMesh(p);

    // should be unmodified
    EXPECT_EQ(static_cast<unsigned int>(aiPrimitiveType_TRIANGLE|aiPrimitiveType_POLYGON),
              p->mPrimitiveTypes);

    delete p;
}